

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::push_back
          (SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> *this,NameIndex *Elt)

{
  uint uVar1;
  
  uVar1 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
      super_SmallVectorBase.Capacity <= uVar1) {
    grow(this,0);
    uVar1 = (this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
            super_SmallVectorBase.Size;
  }
  DWARFDebugNames::NameIndex::NameIndex
            ((NameIndex *)
             ((ulong)uVar1 * 0x98 +
             (long)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                   super_SmallVectorBase.BeginX),Elt);
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }